

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

bool __thiscall
testing::internal::OnCallSpec<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>::Matches
          (OnCallSpec<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)> *this,
          ArgumentTuple *args)

{
  bool bVar1;
  undefined1 uVar2;
  DummyMatchResultListener dummy;
  
  bVar1 = TuplePrefix<2ul>::
          Matches<std::tuple<testing::Matcher<mp::expr::Kind>,testing::Matcher<int>>,std::tuple<mp::expr::Kind,int>>
                    ((tuple<testing::Matcher<mp::expr::Kind>,_testing::Matcher<int>_> *)
                     (this + 0x10),args);
  if (bVar1) {
    uVar2 = (**(code **)(**(long **)(this + 0x48) + 0x20))(*(long **)(this + 0x48),args);
  }
  else {
    uVar2 = 0;
  }
  return (bool)uVar2;
}

Assistant:

bool Matches(const ArgumentTuple& args) const {
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }